

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall Worker::Run(Worker *this)

{
  ssize_t sVar1;
  allocator local_a9;
  string local_a8 [55];
  allocator local_71;
  string local_70 [36];
  undefined1 local_4c [8];
  sockaddr_in addr;
  int sd;
  Worker *this_local;
  
  unique0x10000214 = this;
  memset(local_4c,0,0x10);
  addr.sin_zero._0_4_ = socket(2,2,0);
  if ((int)addr.sin_zero._0_4_ < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Error: Creating socket.",&local_71);
    safe_cout(this,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    exit(1);
  }
  local_4c._0_2_ = 2;
  local_4c._2_2_ = htons(this->port_);
  local_4c._4_4_ = inet_addr(this->dest_);
  while (sVar1 = sendto(addr.sin_zero._0_4_,cflow_cap,700,0,(sockaddr *)local_4c,0x10), -1 < sVar1)
  {
    LOCK();
    (this->requests_->super___atomic_base<unsigned_long>)._M_i =
         (this->requests_->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Error: Sent failed.",&local_a9);
  safe_cout(this,(string *)local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  exit(1);
}

Assistant:

void Worker::Run() {

    int sd;
    struct sockaddr_in addr{};

    if ((sd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
        safe_cout("Error: Creating socket.");
        exit(EXIT_FAILURE);
    }

    addr.sin_family = AF_INET;
    addr.sin_port = htons ((short) (size_t) port_);
    addr.sin_addr.s_addr = inet_addr(dest_);

    while (true) {
        if (sendto(sd, &cflow_cap, sizeof(cflow_cap), 0,
                   (struct sockaddr *) &addr, sizeof(addr)) < 0) {
            safe_cout("Error: Sent failed.");
            exit(EXIT_FAILURE);
        }
        requests_->fetch_add(1);
    }

    close(sd);

}